

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void google::protobuf::FeatureSet::SharedDtor(MessageLite *self)

{
  ulong uVar1;
  LogMessageFatal LStack_18;
  
  internal::InternalMetadata::Delete<google::protobuf::UnknownFieldSet>(&self->_internal_metadata_);
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ExtensionSet::~ExtensionSet((ExtensionSet *)(self + 1));
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_18,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
             ,0x342f,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_18);
}

Assistant:

inline void FeatureSet::SharedDtor(MessageLite& self) {
  FeatureSet& this_ = static_cast<FeatureSet&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.~Impl_();
}